

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O3

int CVmObjFile::s_getp_deleteFile(vm_val_t *retval,uint *in_argc)

{
  int iVar1;
  CVmNetFile *this;
  int *access_00;
  int access;
  vm_rcdesc rc;
  int local_6c;
  vm_rcdesc local_68;
  
  if (s_getp_deleteFile(vm_val_t*,unsigned_int*)::desc == '\0') {
    s_getp_deleteFile();
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,in_argc,&s_getp_deleteFile::desc);
  if (iVar1 == 0) {
    CVmMetaclass::get_class_obj(metaclass_reg_);
    vm_rcdesc::init(&local_68,(EVP_PKEY_CTX *)"File.deleteFile");
    access_00 = &local_6c;
    local_6c = 0x1000;
    this = get_filename_and_access(&local_68,access_00,0,0xb,"application/octet-stream");
    CVmNetFile::close(this,(int)access_00);
    sp_ = sp_ + -1;
    retval->typ = VM_NIL;
  }
  return 1;
}

Assistant:

int CVmObjFile::s_getp_deleteFile(VMG_ vm_val_t *retval, uint *in_argc)
{
    /* check arguments */
    uint argc = (in_argc != 0 ? *in_argc : 0);
    static CVmNativeCodeDesc desc(1);
    if (get_prop_check_argc(retval, in_argc, &desc))
        return TRUE;

    /* get the filename; use the DELETE access mode */
    vm_rcdesc rc(vmg_ "File.deleteFile",
                 CVmObjFile::metaclass_reg_->get_class_obj(vmg0_),
                 VMOBJFILE_DELETE_FILE, G_stk->get(0), argc);
    int access = VMOBJFILE_ACCESS_DELETE;
    CVmNetFile *netfile = get_filename_and_access(
        vmg_ &rc, &access, FALSE, OSFTUNK, "application/octet-stream");

    /* close the network file descriptor - this will delete the file */
    netfile->close(vmg0_);

    /* discard arguments */
    G_stk->discard(1);

    /* no return */
    retval->set_nil();

    /* handled */
    return TRUE;
}